

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_repeat(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ulong uVar1;
  JSValue val_00;
  int iVar2;
  JSValueUnion p;
  JSRefCountHeader *p_1;
  StringBuffer *b;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  JSValue JVar6;
  StringBuffer b_s;
  int64_t val;
  StringBuffer local_58;
  ulong local_38;
  
  JVar6 = JS_ToStringCheckObject(ctx,this_val);
  p = JVar6.u;
  uVar5 = (uint)JVar6.tag;
  if (uVar5 != 6) {
    val_00 = *argv;
    if (0xfffffff4 < (uint)argv->tag) {
      *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
    }
    iVar2 = JS_ToInt64SatFree(ctx,(int64_t *)&local_38,val_00);
    if (iVar2 == 0) {
      if ((local_38 & 0xffffffff80000000) == 0) {
        if (local_38 == 1) {
          return JVar6;
        }
        uVar1 = *(ulong *)((long)p.ptr + 4);
        uVar3 = (uint)uVar1 & 0x7fffffff;
        if ((uVar1 & 0x7fffffff) == 0) {
          return JVar6;
        }
        if (((uint)uVar1 & 0x7fffffff) * local_38 < 0x40000000) {
          iVar2 = (int)local_38;
          local_58.size = uVar3 * iVar2;
          local_58.is_wide_char = (uint)(uVar1 >> 0x1f) & 1;
          local_58.len = 0;
          local_58.error_status = 0;
          local_58.ctx = ctx;
          local_58.str = js_alloc_string(ctx,local_58.size,local_58.is_wide_char);
          if (local_58.str != (JSString *)0x0) {
            if (uVar3 == 1) {
              if ((*(byte *)((long)p.ptr + 7) & 0x80) == 0) {
                uVar3 = (uint)(byte)(((JSString *)((long)p.ptr + 0x10))->header).ref_count;
              }
              else {
                uVar3 = (uint)(ushort)(((JSString *)((long)p.ptr + 0x10))->header).ref_count;
              }
              string_buffer_fill(&local_58,uVar3,iVar2);
            }
            else if (local_38 != 0) {
              uVar4 = iVar2 + 1;
              do {
                string_buffer_concat(&local_58,(JSString *)p.ptr,0,uVar3);
                uVar4 = uVar4 - 1;
              } while (1 < uVar4);
            }
            if ((0xfffffff4 < uVar5) && (iVar2 = *p.ptr, *(int *)p.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar6);
            }
            JVar6 = string_buffer_end(&local_58);
            return JVar6;
          }
        }
        else {
          JS_ThrowInternalError(ctx,"string too long");
        }
      }
      else {
        JS_ThrowRangeError(ctx,"invalid repeat count");
      }
    }
  }
  if ((0xfffffff4 < uVar5) && (iVar2 = *p.ptr, *(int *)p.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar6);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_string_repeat(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int64_t val;
    int n, len;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        goto fail;
    if (JS_ToInt64Sat(ctx, &val, argv[0]))
        goto fail;
    if (val < 0 || val > 2147483647) {
        JS_ThrowRangeError(ctx, "invalid repeat count");
        goto fail;
    }
    n = val;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (len == 0 || n == 1)
        return str;
    if (val * len > JS_STRING_LEN_MAX) {
        JS_ThrowInternalError(ctx, "string too long");
        goto fail;
    }
    if (string_buffer_init2(ctx, b, n * len, p->is_wide_char))
        goto fail;
    if (len == 1) {
        string_buffer_fill(b, string_get(p, 0), n);
    } else {
        while (n-- > 0) {
            string_buffer_concat(b, p, 0, len);
        }
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    JS_FreeValue(ctx, str);
    return JS_EXCEPTION;
}